

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::LdHeapArgumentsImpl<true>
          (InterpreterStackFrame *this,Var argsArray,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *pRVar3;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  JavascriptFunction *funcCallee;
  Var pvVar6;
  Var args;
  Var frameObj;
  ScriptContext *scriptContext_local;
  Var argsArray_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = FunctionBody::HasScopeObject(*(FunctionBody **)(this + 0x88));
  if (bVar2) {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    pRVar3 = JavascriptLibraryBase::GetNull(&pJVar5->super_JavascriptLibraryBase);
    if ((RecyclableObject *)argsArray != pRVar3) {
      args = *(Var *)(this + 0x58);
      if (args == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x24ce,"(frameObj)","frameObj");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      goto LAB_00f4d821;
    }
  }
  pJVar5 = ScriptContext::GetLibrary(scriptContext);
  args = JavascriptLibraryBase::GetNull(&pJVar5->super_JavascriptLibraryBase);
LAB_00f4d821:
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  pvVar6 = Js::JavascriptOperators::LoadHeapArguments
                     (funcCallee,*(int *)(this + 0x18) - 1,(Var *)(*(long *)(this + 0x20) + 8),args,
                      argsArray,scriptContext,true);
  *(Var *)(this + 0x40) = pvVar6;
  return pvVar6;
}

Assistant:

Var InterpreterStackFrame::LdHeapArgumentsImpl(Var argsArray, ScriptContext* scriptContext)
    {
        Var frameObj;
        if (m_functionBody->HasScopeObject() && argsArray != scriptContext->GetLibrary()->GetNull())
        {
            frameObj = this->localClosure;
            Assert(frameObj);
        }
        else
        {
            frameObj = scriptContext->GetLibrary()->GetNull();
        }
        Var args = JavascriptOperators::LoadHeapArguments(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, &this->m_inParams[1], frameObj, argsArray, scriptContext, letArgs);
        this->m_arguments = args;
        return args;
    }